

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  long lVar1;
  int iVar2;
  size_t __size;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  size_t i;
  int *__ptr;
  int *__ptr_00;
  unsigned_short *__ptr_01;
  ulong uVar7;
  uint *puVar8;
  uint *puVar9;
  uint *frequencies;
  void *__ptr_02;
  void *__ptr_03;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uchar *puVar15;
  ulong uVar16;
  int *piVar17;
  ulong uVar18;
  ulong uVar19;
  uint *puVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  LodePNGBitWriter local_1e0;
  LodePNGCompressSettings *local_1d0;
  uchar *local_1c8;
  long local_1c0;
  size_t local_1b8;
  ulong local_1b0;
  void *local_1a8;
  unsigned_short *local_1a0;
  uint *local_198;
  int *local_190;
  unsigned_short *local_188;
  uchar **local_180;
  size_t *local_178;
  ulong local_170;
  ulong local_168;
  ucvector v;
  HuffmanTree tree_ll;
  uivector lz77_encoded;
  HuffmanTree tree_d;
  HuffmanTree local_88;
  Hash hash;
  
  v.data = *out;
  v.size = *outsize;
  local_1e0.data = &v;
  local_1e0.bp = '\0';
  uVar6 = settings->btype;
  if (uVar6 < 3) {
    local_170 = insize;
    local_1b8 = insize;
    local_180 = out;
    local_178 = outsize;
    v.allocsize = v.size;
    if (uVar6 != 1) {
      if (uVar6 == 0) {
        uVar6 = 0;
        lVar21 = 0;
        uVar18 = (insize + 0xfffe) / 0xffff;
        while (sVar11 = v.size, outsize = local_178, out = local_180, uVar18 != 0) {
          uVar14 = (int)local_1b8 - (int)lVar21;
          if (0xfffe < local_1b8 - lVar21) {
            uVar14 = 0xffff;
          }
          uVar13 = (ulong)uVar14;
          uVar5 = ucvector_resize(&v,uVar13 + v.size + 5);
          if (uVar5 == 0) {
            uVar6 = 0x53;
            outsize = local_178;
            out = local_180;
            break;
          }
          v.data[sVar11] = uVar18 == 1;
          v.data[sVar11 + 1] = (uchar)uVar14;
          v.data[sVar11 + 2] = (uchar)(uVar14 >> 8);
          v.data[sVar11 + 3] = (uchar)(0xffff - uVar14);
          v.data[sVar11 + 4] = (uchar)(0xffff - uVar14 >> 8);
          lodepng_memcpy(v.data + sVar11 + 5,in + lVar21,uVar13);
          lVar21 = lVar21 + uVar13;
          uVar18 = uVar18 - 1;
        }
        goto LAB_001476b7;
      }
      uVar18 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar18 = insize >> 3;
      }
      if (0x3fff7 < uVar18) {
        uVar18 = 0x3fff8;
      }
      local_170 = uVar18 + 8;
    }
    uVar18 = 1;
    if (!CARRY8(insize - 1,local_170)) {
      uVar18 = ((insize - 1) + local_170) / local_170;
    }
    uVar13 = (ulong)settings->windowsize;
    __ptr = (int *)malloc(0x40000);
    hash.head = __ptr;
    __ptr_00 = (int *)malloc(uVar13 * 4);
    __size = uVar13 * 2;
    hash.val = __ptr_00;
    local_188 = (unsigned_short *)malloc(__size);
    hash.chain = local_188;
    __ptr_01 = (unsigned_short *)malloc(__size);
    hash.zeros = __ptr_01;
    local_190 = (int *)malloc(0x40c);
    hash.headz = local_190;
    local_1a0 = (unsigned_short *)malloc(__size);
    uVar6 = 0x53;
    hash.chainz = local_1a0;
    if (((((__ptr_00 != (int *)0x0) && (__ptr != (int *)0x0)) &&
         (local_188 != (unsigned_short *)0x0)) &&
        ((__ptr_01 != (unsigned_short *)0x0 && (local_190 != (int *)0x0)))) &&
       (local_1a0 != (unsigned_short *)0x0)) {
      for (lVar21 = 0; lVar21 != 0x10000; lVar21 = lVar21 + 1) {
        __ptr[lVar21] = -1;
      }
      for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
        __ptr_00[uVar7] = -1;
      }
      for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
        local_188[uVar7] = (unsigned_short)uVar7;
      }
      for (lVar21 = 0; lVar21 != 0x103; lVar21 = lVar21 + 1) {
        local_190[lVar21] = -1;
      }
      for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
        local_1a0[uVar7] = (unsigned_short)uVar7;
      }
      lVar21 = 0;
      uVar16 = 0;
      uVar6 = 0;
      uVar13 = local_170;
      uVar7 = local_1b8;
      puVar15 = in;
      local_1d0 = settings;
      while ((uVar16 != uVar18 && (uVar6 == 0))) {
        uVar19 = uVar16 * uVar13;
        uVar10 = uVar19 + uVar13;
        if (uVar7 <= uVar19 + uVar13) {
          uVar10 = uVar7;
        }
        uVar14 = (uint)(uVar16 == uVar18 - 1);
        if (settings->btype == 2) {
          local_198 = (uint *)CONCAT44(local_198._4_4_,uVar14);
          lz77_encoded.allocsize = 0;
          lz77_encoded.data = (uint *)0x0;
          lz77_encoded.size = 0;
          tree_ll.codes = (uint *)0x0;
          tree_ll.lengths = (uint *)0x0;
          tree_ll.table_len = (uchar *)0x0;
          tree_ll.table_value = (unsigned_short *)0x0;
          tree_d.codes = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          tree_d.table_len = (uchar *)0x0;
          tree_d.table_value = (unsigned_short *)0x0;
          local_88.codes = (uint *)0x0;
          local_88.lengths = (uint *)0x0;
          local_88.table_len = (uchar *)0x0;
          local_88.table_value = (unsigned_short *)0x0;
          local_1c8 = puVar15;
          local_1c0 = lVar21;
          local_168 = uVar16;
          puVar8 = (uint *)malloc(0x478);
          puVar9 = (uint *)malloc(0x78);
          frequencies = (uint *)malloc(0x4c);
          if (frequencies == (uint *)0x0 || (puVar9 == (uint *)0x0 || puVar8 == (uint *)0x0)) {
LAB_0014707e:
            __ptr_03 = (void *)0x0;
            __ptr_02 = (void *)0x0;
LAB_00147084:
            uVar6 = 0x53;
          }
          else {
            for (lVar21 = 0; lVar21 != 0x478; lVar21 = lVar21 + 1) {
              *(undefined1 *)((long)puVar8 + lVar21) = 0;
            }
            for (lVar21 = 0; lVar21 != 0x78; lVar21 = lVar21 + 1) {
              *(undefined1 *)((long)puVar9 + lVar21) = 0;
            }
            for (lVar21 = 0; lVar21 != 0x4c; lVar21 = lVar21 + 1) {
              *(undefined1 *)((long)frequencies + lVar21) = 0;
            }
            if (local_1d0->use_lz77 == 0) {
              uVar6 = uivector_resize(&lz77_encoded,uVar10 - uVar19);
              if (uVar6 == 0) goto LAB_0014707e;
              for (lVar21 = 0; (ulong)(local_1c0 + lVar21) < uVar10; lVar21 = lVar21 + 1) {
                lz77_encoded.data[lVar21] = (uint)local_1c8[lVar21];
              }
LAB_00146fb4:
              for (sVar11 = 0; sVar11 != lz77_encoded.size; sVar11 = sVar11 + 1) {
                uVar6 = lz77_encoded.data[sVar11];
                puVar8[uVar6] = puVar8[uVar6] + 1;
                if (0x100 < (ulong)uVar6) {
                  puVar9[lz77_encoded.data[sVar11 + 2]] = puVar9[lz77_encoded.data[sVar11 + 2]] + 1;
                  sVar11 = sVar11 + 3;
                }
              }
              puVar8[0x100] = 1;
              uVar6 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar8,0x101,0x11e,0xf);
              if ((uVar6 == 0) &&
                 (uVar6 = HuffmanTree_makeFromFrequencies(&tree_d,puVar9,2,0x1e,0xf), uVar6 == 0)) {
                uVar14 = tree_ll.numcodes;
                if (0x11d < tree_ll.numcodes) {
                  uVar14 = 0x11e;
                }
                uVar7 = (ulong)uVar14;
                uVar13 = (ulong)tree_d.numcodes;
                if (0x1d < tree_d.numcodes) {
                  uVar13 = 0x1e;
                }
                uVar16 = uVar13 + uVar7;
                uVar10 = (ulong)(uint)((int)uVar16 * 4);
                __ptr_02 = malloc(uVar10);
                __ptr_03 = malloc(uVar10);
                puVar3 = tree_ll.lengths;
                if (__ptr_03 == (void *)0x0 || __ptr_02 == (void *)0x0) goto LAB_00147084;
                for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
                  *(uint *)((long)__ptr_02 + uVar10 * 4) = tree_ll.lengths[uVar10];
                }
                for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
                  *(uint *)((long)__ptr_02 + uVar10 * 4 + uVar7 * 4) = tree_d.lengths[uVar10];
                }
                lVar21 = 0;
                for (uVar7 = 0; uVar7 != uVar16; uVar7 = uVar7 + 1) {
                  iVar2 = *(int *)((long)__ptr_02 + uVar7 * 4);
                  uVar6 = 0;
                  while( true ) {
                    uVar19 = (ulong)uVar6;
                    uVar10 = uVar7 + 1 + uVar19;
                    if ((uVar16 <= uVar10) || (*(int *)((long)__ptr_02 + uVar10 * 4) != iVar2))
                    break;
                    uVar6 = uVar6 + 1;
                  }
                  if ((iVar2 == 0) && (1 < uVar6)) {
                    uVar5 = uVar6 + 1;
                    if (uVar5 < 0xb) {
                      *(undefined4 *)((long)__ptr_03 + lVar21 * 4) = 0x11;
                      *(uint *)((long)__ptr_03 + lVar21 * 4 + 4) = uVar6 - 2;
                    }
                    else {
                      if (0x89 < uVar5) {
                        uVar5 = 0x8a;
                      }
                      *(undefined4 *)((long)__ptr_03 + lVar21 * 4) = 0x12;
                      *(uint *)((long)__ptr_03 + lVar21 * 4 + 4) = uVar5 - 0xb;
                      uVar19 = (ulong)(uVar5 - 1);
                    }
                    lVar21 = lVar21 + 2;
LAB_00147434:
                    uVar7 = uVar7 + uVar19;
                  }
                  else {
                    if (2 < uVar6) {
                      *(int *)((long)__ptr_03 + lVar21 * 4) = iVar2;
                      piVar17 = (int *)((long)__ptr_03 + lVar21 * 4 + 8);
                      for (lVar12 = 0; (ulong)((uVar6 / 6) * 2) + lVar12 != 0; lVar12 = lVar12 + -2)
                      {
                        piVar17[-1] = 0x10;
                        piVar17[0] = 3;
                        piVar17 = piVar17 + 2;
                      }
                      if (uVar6 % 6 < 3) {
                        lVar21 = (lVar21 - lVar12) + 1;
                        uVar19 = (ulong)(uVar6 - uVar6 % 6);
                      }
                      else {
                        piVar17[-1] = 0x10;
                        lVar21 = (lVar21 - lVar12) + 3;
                        *piVar17 = uVar6 % 6 - 3;
                      }
                      goto LAB_00147434;
                    }
                    *(int *)((long)__ptr_03 + lVar21 * 4) = iVar2;
                    lVar21 = lVar21 + 1;
                  }
                }
                for (lVar12 = 0; lVar12 != lVar21; lVar12 = (lVar12 - (ulong)(uVar7 < 0x10)) + 2) {
                  uVar7 = (ulong)*(uint *)((long)__ptr_03 + lVar12 * 4);
                  frequencies[uVar7] = frequencies[uVar7] + 1;
                }
                uVar6 = HuffmanTree_makeFromFrequencies(&local_88,frequencies,0x13,0x13,7);
                puVar4 = local_88.lengths;
                if (uVar6 == 0) {
                  uVar7 = 0x14;
                  lVar12 = 0x13;
                  do {
                    lVar22 = lVar12;
                    local_1b0 = uVar7 - 1;
                    if (local_1b0 < 5) {
                      local_1b0 = 4;
                      break;
                    }
                    lVar1 = uVar7 * 4;
                    uVar7 = local_1b0;
                    lVar12 = lVar22 + -1;
                  } while (local_88.lengths[*(uint *)(&UNK_0017dfc8 + lVar1)] == 0);
                  local_1a8 = __ptr_03;
                  writeBits(&local_1e0,(uint)local_198,1);
                  writeBits(&local_1e0,0,1);
                  writeBits(&local_1e0,1,1);
                  local_1b0 = (ulong)((int)local_1b0 - 4);
                  writeBits(&local_1e0,uVar14 - 0x101,5);
                  writeBits(&local_1e0,(int)uVar13 - 1,5);
                  writeBits(&local_1e0,(uint)local_1b0,4);
                  puVar20 = CLCL_ORDER;
                  while (bVar23 = lVar22 != 0, lVar22 = lVar22 + -1, bVar23) {
                    writeBits(&local_1e0,puVar4[*puVar20],3);
                    puVar20 = puVar20 + 1;
                  }
                  local_198 = local_88.codes;
                  __ptr_03 = local_1a8;
                  for (lVar12 = 0; lVar12 != lVar21; lVar12 = lVar12 + 1) {
                    uVar6 = *(uint *)((long)__ptr_03 + lVar12 * 4);
                    writeBitsReversed(&local_1e0,local_198[uVar6],(ulong)puVar4[uVar6]);
                    __ptr_03 = local_1a8;
                    if (uVar6 - 0x10 < 3) {
                      lVar22 = lVar12 * 4;
                      lVar12 = lVar12 + 1;
                      writeBits(&local_1e0,*(uint *)((long)local_1a8 + lVar22 + 4),
                                *(size_t *)(&DAT_0017e0a0 + (ulong)(uVar6 - 0x10) * 8));
                    }
                  }
                  writeLZ77data(&local_1e0,&lz77_encoded,&tree_ll,&tree_d);
                  if ((ulong)puVar3[0x100] == 0) {
                    uVar6 = 0x40;
                  }
                  else {
                    writeBitsReversed(&local_1e0,tree_ll.codes[0x100],(ulong)puVar3[0x100]);
                    uVar6 = 0;
                  }
                }
                goto LAB_0014708a;
              }
            }
            else {
              uVar6 = encodeLZ77(&lz77_encoded,&hash,in,uVar19,uVar10,local_1d0->windowsize,
                                 local_1d0->minmatch,local_1d0->nicematch,local_1d0->lazymatching);
              if (uVar6 == 0) goto LAB_00146fb4;
            }
            __ptr_03 = (void *)0x0;
            __ptr_02 = (void *)0x0;
          }
LAB_0014708a:
          uivector_cleanup(&lz77_encoded);
          HuffmanTree_cleanup(&tree_ll);
          HuffmanTree_cleanup(&tree_d);
          HuffmanTree_cleanup(&local_88);
          free(puVar8);
          free(puVar9);
          free(frequencies);
          free(__ptr_02);
          free(__ptr_03);
          uVar13 = local_170;
          lVar21 = local_1c0;
          uVar7 = local_1b8;
          puVar15 = local_1c8;
          uVar16 = local_168;
          settings = local_1d0;
        }
        else {
          uVar6 = 0;
          if (settings->btype == 1) {
            tree_ll.codes = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_ll.table_len = (uchar *)0x0;
            tree_ll.table_value = (unsigned_short *)0x0;
            tree_d.codes = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_d.table_len = (uchar *)0x0;
            tree_d.table_value = (unsigned_short *)0x0;
            local_1c8 = puVar15;
            local_1c0 = lVar21;
            local_168 = uVar16;
            uVar6 = generateFixedLitLenTree(&tree_ll);
            if ((uVar6 == 0) && (uVar6 = generateFixedDistanceTree(&tree_d), uVar6 == 0)) {
              writeBits(&local_1e0,uVar14,1);
              writeBits(&local_1e0,1,1);
              writeBits(&local_1e0,0,1);
              puVar9 = tree_ll.lengths;
              puVar8 = tree_ll.codes;
              if (local_1d0->use_lz77 == 0) {
                for (; uVar19 < uVar10; uVar19 = uVar19 + 1) {
                  writeBitsReversed(&local_1e0,puVar8[in[uVar19]],(ulong)puVar9[in[uVar19]]);
                }
              }
              else {
                local_88.codes = (uint *)0x0;
                local_88.lengths = (uint *)0x0;
                local_88.maxbitlen = 0;
                local_88.numcodes = 0;
                uVar6 = encodeLZ77((uivector *)&local_88,&hash,in,uVar19,uVar10,
                                   local_1d0->windowsize,local_1d0->minmatch,local_1d0->nicematch,
                                   local_1d0->lazymatching);
                if (uVar6 != 0) {
                  uivector_cleanup(&local_88);
                  goto LAB_00146e38;
                }
                writeLZ77data(&local_1e0,(uivector *)&local_88,&tree_ll,&tree_d);
                uivector_cleanup(&local_88);
                puVar8 = tree_ll.codes;
                puVar9 = tree_ll.lengths;
              }
              writeBitsReversed(&local_1e0,puVar8[0x100],(ulong)puVar9[0x100]);
              uVar6 = 0;
              uVar7 = local_1b8;
            }
LAB_00146e38:
            HuffmanTree_cleanup(&tree_ll);
            HuffmanTree_cleanup(&tree_d);
            uVar13 = local_170;
            lVar21 = local_1c0;
            puVar15 = local_1c8;
            uVar16 = local_168;
            settings = local_1d0;
          }
        }
        uVar16 = uVar16 + 1;
        puVar15 = puVar15 + uVar13;
        lVar21 = lVar21 + uVar13;
      }
    }
    free(__ptr);
    free(__ptr_00);
    free(local_188);
    free(__ptr_01);
    free(local_190);
    free(local_1a0);
    outsize = local_178;
    out = local_180;
  }
  else {
    uVar6 = 0x3d;
  }
LAB_001476b7:
  *out = v.data;
  *outsize = v.size;
  return uVar6;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}